

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

string * __thiscall
re2::FormatCapture_abi_cxx11_
          (string *__return_storage_ptr__,re2 *this,StringPiece *text,StringPiece *s)

{
  int iVar1;
  allocator local_9;
  
  if (text->ptr_ == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"(?,?)",&local_9);
  }
  else {
    iVar1 = (int)text->ptr_;
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"(%d,%d)",(ulong)(uint)(iVar1 - *(int *)this),
               (ulong)(uint)((iVar1 + text->length_) - *(int *)this));
  }
  return __return_storage_ptr__;
}

Assistant:

static string FormatCapture(const StringPiece& text, const StringPiece& s) {
  if (s.begin() == NULL)
    return "(?,?)";
  return StringPrintf("(%d,%d)",
                      static_cast<int>(s.begin() - text.begin()),
                      static_cast<int>(s.end() - text.begin()));
}